

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O3

void __thiscall
boost::shared_ptr<boost::detail::thread_data_base>::shared_ptr<boost::detail::thread_data_base>
          (shared_ptr<boost::detail::thread_data_base> *this,
          weak_ptr<boost::detail::thread_data_base> *r)

{
  int iVar1;
  sp_counted_base *psVar2;
  int iVar3;
  bool bVar4;
  bad_weak_ptr local_10;
  
  psVar2 = (r->pn).pi_;
  (this->pn).pi_ = psVar2;
  if (psVar2 != (sp_counted_base *)0x0) {
    iVar3 = psVar2->use_count_;
    while (iVar3 != 0) {
      LOCK();
      iVar1 = psVar2->use_count_;
      bVar4 = iVar3 == iVar1;
      if (bVar4) {
        psVar2->use_count_ = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
      if (bVar4) {
        this->px = r->px;
        return;
      }
    }
  }
  local_10 = (bad_weak_ptr)&PTR__exception_001cc778;
  throw_exception<boost::bad_weak_ptr>(&local_10);
}

Assistant:

shared_ptr( shared_ptr && r ) BOOST_SP_NOEXCEPT : px( r.px ), pn()
    {
        pn.swap( r.pn );
        r.px = 0;
    }